

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_StArrWasm<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint sourceContextId;
  undefined4 *puVar7;
  WebAssemblyMemory *pWVar8;
  ArrayBufferBase *pAVar9;
  undefined4 extraout_var;
  long lVar11;
  undefined1 uVar12;
  undefined2 uVar13;
  undefined4 uVar14;
  ulong uVar15;
  long lVar10;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x23aa,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar4) goto LAB_00a67a64;
    *puVar7 = 0;
  }
  uVar1 = playout->Offset;
  uVar2 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  pWVar8 = GetWebAssemblyMemory(this);
  pAVar9 = WebAssemblyMemory::GetBuffer(pWVar8);
  uVar5 = (*(pAVar9->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pAVar9);
  iVar6 = (*(pAVar9->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(pAVar9);
  lVar10 = CONCAT44(extraout_var,iVar6);
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x23b8,"((0))","UNREACHED");
    if (!bVar4) goto LAB_00a67a64;
    *puVar7 = 0;
    goto LAB_00a6788f;
  }
  uVar15 = (ulong)uVar2 + (ulong)uVar1;
  switch(playout->ViewType) {
  default:
    if (uVar5 <= uVar15) {
LAB_00a67a54:
      JavascriptError::ThrowWebAssemblyRuntimeError
                (*(ScriptContext **)(this + 0x78),-0x7ff5e497,(PCWSTR)0x0);
    }
    uVar12 = *(undefined1 *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
    goto LAB_00a6788b;
  case TYPE_INT16:
  case TYPE_UINT16:
    if ((ulong)uVar5 < uVar15 + 2) goto LAB_00a67a54;
    uVar13 = *(undefined2 *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
    goto LAB_00a67844;
  case TYPE_INT32:
  case TYPE_UINT32:
    if ((ulong)uVar5 < uVar15 + 4) goto LAB_00a67a54;
    uVar14 = *(undefined4 *)(*(long *)(this + 0x118) + (ulong)playout->Value * 4);
    goto LAB_00a6786a;
  case TYPE_FLOAT32:
    if ((ulong)uVar5 < uVar15 + 4) goto LAB_00a67a54;
    *(undefined4 *)(lVar10 + uVar15) =
         *(undefined4 *)(*(long *)(this + 0x130) + (ulong)playout->Value * 4);
    break;
  case TYPE_FLOAT64:
    if ((ulong)uVar5 < uVar15 + 8) goto LAB_00a67a54;
    *(undefined8 *)(lVar10 + uVar15) =
         *(undefined8 *)(*(long *)(this + 0x128) + (ulong)playout->Value * 8);
    break;
  case TYPE_INT64:
    if ((ulong)uVar5 < uVar15 + 8) goto LAB_00a67a54;
    *(undefined8 *)(lVar10 + uVar15) =
         *(undefined8 *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
    break;
  case TYPE_INT8_TO_INT64:
  case TYPE_UINT8_TO_INT64:
    if (uVar5 <= uVar15) goto LAB_00a67a54;
    uVar12 = *(undefined1 *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
LAB_00a6788b:
    *(undefined1 *)(lVar10 + uVar15) = uVar12;
    break;
  case TYPE_INT16_TO_INT64:
  case TYPE_UINT16_TO_INT64:
    if ((ulong)uVar5 < uVar15 + 2) goto LAB_00a67a54;
    uVar13 = *(undefined2 *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
LAB_00a67844:
    *(undefined2 *)(lVar10 + uVar15) = uVar13;
    break;
  case TYPE_INT32_TO_INT64:
  case TYPE_UINT32_TO_INT64:
    if ((ulong)uVar5 < uVar15 + 4) goto LAB_00a67a54;
    uVar14 = *(undefined4 *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8);
LAB_00a6786a:
    *(undefined4 *)(lVar10 + uVar15) = uVar14;
  }
LAB_00a6788f:
  sourceContextId = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
  lVar10 = *(long *)(this + 0x88);
  lVar11 = *(long *)(lVar10 + 0x10);
  if (lVar11 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) {
LAB_00a67a64:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
    lVar11 = *(long *)(lVar10 + 0x10);
  }
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015b6718,WasmMemWritesPhase,sourceContextId,
                            *(LocalFunctionId *)(lVar11 + 0x10));
  if (bVar4) {
    GetWebAssemblyMemory(this);
    pWVar8 = GetWebAssemblyMemory(this);
    WebAssemblyMemory::TraceMemWrite
              (pWVar8,*(uint32 *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4),
               playout->Offset,playout->ViewType,*(uint32 *)(this + 0x108),
               *(ScriptContext **)(this + 0x78));
    return;
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_StArrWasm(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            WasmArrayBoundsCheck<MemType>(index, byteLength); \
            *(MemType*)(buffer + index) = (MemType)(GetRegRaw<RegType>(playout->Value)); \
            break;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
        CompileAssert(ArrayBufferView::ViewType::TYPE_COUNT == 15);
#if DBG
        if (PHASE_TRACE(WasmMemWritesPhase, m_functionBody))
        {
            GetWebAssemblyMemory()->TraceMemWrite(GetWebAssemblyMemory(), (uint32)GetRegRawInt(playout->SlotIndex), playout->Offset, playout->ViewType, (uint32)(size_t)this->DEBUG_currentByteOffset, scriptContext);
        }
#endif
        return;
#else
        Assert(UNREACHED);
#endif
    }